

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::MethodDescriptorProto::Clear(MethodDescriptorProto *this)

{
  byte bVar1;
  string *psVar2;
  
  bVar1 = (byte)this->_has_bits_[0];
  if (bVar1 != 0) {
    if (((bVar1 & 1) != 0) &&
       (psVar2 = this->name_, psVar2 != (string *)&internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_[0] & 2) != 0) &&
       (psVar2 = this->input_type_, psVar2 != (string *)&internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_[0] & 4) != 0) &&
       (psVar2 = this->output_type_, psVar2 != (string *)&internal::kEmptyString_abi_cxx11_)) {
      psVar2->_M_string_length = 0;
      *(psVar2->_M_dataplus)._M_p = '\0';
    }
    if (((this->_has_bits_[0] & 8) != 0) && (this->options_ != (MethodOptions *)0x0)) {
      MethodOptions::Clear(this->options_);
    }
  }
  this->_has_bits_[0] = 0;
  if ((this->_unknown_fields_).fields_ !=
      (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *)0x0
     ) {
    UnknownFieldSet::ClearFallback(&this->_unknown_fields_);
    return;
  }
  return;
}

Assistant:

void MethodDescriptorProto::Clear() {
  if (_has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (has_name()) {
      if (name_ != &::google::protobuf::internal::kEmptyString) {
        name_->clear();
      }
    }
    if (has_input_type()) {
      if (input_type_ != &::google::protobuf::internal::kEmptyString) {
        input_type_->clear();
      }
    }
    if (has_output_type()) {
      if (output_type_ != &::google::protobuf::internal::kEmptyString) {
        output_type_->clear();
      }
    }
    if (has_options()) {
      if (options_ != NULL) options_->::google::protobuf::MethodOptions::Clear();
    }
  }
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
  mutable_unknown_fields()->Clear();
}